

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kf_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_46c44b::ForcedKeyTestLarge::SetUp(ForcedKeyTestLarge *this)

{
  long in_RDI;
  TestMode in_stack_000000bc;
  EncoderTest *in_stack_000000c0;
  
  libaom_test::EncoderTest::InitializeConfig(in_stack_000000c0,in_stack_000000bc);
  *(undefined4 *)(in_RDI + 0x90) = *(undefined4 *)(in_RDI + 0x404);
  *(undefined4 *)(in_RDI + 0x34) = 0;
  *(undefined4 *)(in_RDI + 0xf0) = 0x1e;
  *(undefined4 *)(in_RDI + 0xec) = 0;
  *(undefined4 *)(in_RDI + 0xe4) = *(undefined4 *)(in_RDI + 0x3fc);
  return;
}

Assistant:

void SetUp() override {
    InitializeConfig(encoding_mode_);
    cfg_.rc_end_usage = rc_end_usage_;
    cfg_.g_threads = 0;
    cfg_.kf_max_dist = 30;
    cfg_.kf_min_dist = 0;
    cfg_.fwd_kf_enabled = fwd_kf_enabled_;
  }